

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O3

WebPChunk * ChunkSearchList(WebPChunk *first,uint32_t nth,uint32_t tag)

{
  int iVar1;
  WebPChunk *pWVar2;
  uint32_t iter;
  bool bVar3;
  bool bVar4;
  
  while( true ) {
    if (first == (WebPChunk *)0x0) {
      return (WebPChunk *)0x0;
    }
    if (first->tag_ == tag) break;
    first = first->next_;
  }
  iVar1 = nth - 1;
  pWVar2 = first;
  if (iVar1 == 0) {
    bVar3 = false;
  }
  else {
    do {
      first = pWVar2->next_;
      bVar3 = first == (WebPChunk *)0x0;
      bVar4 = bVar3;
      while( true ) {
        if (bVar4) {
          bVar3 = true;
          first = pWVar2;
          goto LAB_0014e7f4;
        }
        if (first->tag_ == tag) break;
        first = first->next_;
        bVar4 = first == (WebPChunk *)0x0;
      }
      iVar1 = iVar1 + -1;
      pWVar2 = first;
    } while (iVar1 != 0);
  }
LAB_0014e7f4:
  pWVar2 = (WebPChunk *)0x0;
  if (!bVar3) {
    pWVar2 = first;
  }
  if (nth == 0) {
    pWVar2 = first;
  }
  return pWVar2;
}

Assistant:

WebPChunk* ChunkSearchList(WebPChunk* first, uint32_t nth, uint32_t tag) {
  uint32_t iter = nth;
  first = ChunkSearchNextInList(first, tag);
  if (first == NULL) return NULL;

  while (--iter != 0) {
    WebPChunk* next_chunk = ChunkSearchNextInList(first->next_, tag);
    if (next_chunk == NULL) break;
    first = next_chunk;
  }
  return ((nth > 0) && (iter > 0)) ? NULL : first;
}